

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garray.c
# Opt level: O0

gchar * array_free(GRealArray *array,ArrayFreeFlags flags)

{
  uint local_24;
  guint8 *pgStack_20;
  guint i;
  gchar *segment;
  ArrayFreeFlags flags_local;
  GRealArray *array_local;
  
  if ((flags & FREE_SEGMENT) == 0) {
    pgStack_20 = array->data;
  }
  else {
    if (array->clear_func != (GDestroyNotify)0x0) {
      for (local_24 = 0; local_24 < array->len; local_24 = local_24 + 1) {
        (*array->clear_func)(array->data + array->elt_size * local_24);
      }
    }
    g_free(array->data);
    pgStack_20 = (guint8 *)0x0;
  }
  if ((flags & PRESERVE_WRAPPER) == 0) {
    g_slice_free1(0x20,array);
  }
  else {
    array->data = (guint8 *)0x0;
    array->len = 0;
    array->alloc = 0;
  }
  return (gchar *)pgStack_20;
}

Assistant:

static gchar *array_free (GRealArray *array, ArrayFreeFlags flags)
{
    gchar *segment;

    if (flags & FREE_SEGMENT)
    {
        if (array->clear_func != NULL)
        {
            guint i;

            for (i = 0; i < array->len; i++)
                array->clear_func (g_array_elt_pos (array, i));
        }

        g_free (array->data);
        segment = NULL;
    }
    else
        segment = (gchar*) array->data;

    if (flags & PRESERVE_WRAPPER)
    {
        array->data            = NULL;
        array->len             = 0;
        array->alloc           = 0;
    }
    else
    {
        g_slice_free1 (sizeof (GRealArray), array);
    }

    return segment;
}